

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_value_store.cpp
# Opt level: O3

pair<bool,_const_FlaggedValue_&> __thiscall
KeyValueStore::get(KeyValueStore *this,vector<char,_std::allocator<char>_> *key)

{
  int iVar1;
  const_iterator cVar2;
  mapped_type *pmVar3;
  undefined8 uVar4;
  undefined8 unaff_RBP;
  pair<bool,_const_FlaggedValue_&> pVar5;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    cVar2 = std::
            _Hashtable<std::vector<char,_std::allocator<char>_>,_std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->data)._M_h,key);
    pmVar3 = std::__detail::
             _Map_base<std::vector<char,_std::allocator<char>_>,_std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::vector<char,_std::allocator<char>_>,_std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>,_std::allocator<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<char,_std::allocator<char>_>_>,_std::hash<std::vector<char,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->data,key);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    pVar5._0_8_ = CONCAT71((int7)((ulong)unaff_RBP >> 8),
                           cVar2.
                           super__Node_iterator_base<std::pair<const_std::vector<char,_std::allocator<char>_>,_FlaggedValue>,_true>
                           ._M_cur != (__node_type *)0x0) & 0xffffffff;
    pVar5.second = pmVar3;
    return pVar5;
  }
  uVar4 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

std::pair<bool, const FlaggedValue&> KeyValueStore::get(
    const std::vector<char>& key) {
  std::lock_guard<std::mutex> lk(mut);
  return std::make_pair(data.count(key) > 0, std::ref(data[key]));
}